

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayGenerateMipMap.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayGenerateMipMapFilterable::generateTestData
          (TextureCubeMapArrayGenerateMipMapFilterable *this,int n_layer,uchar *data,int width,
          int height)

{
  uint n_color;
  uchar *result_ptr;
  uint pixel_size;
  int n_component;
  int y;
  int x;
  int height_local;
  int width_local;
  uchar *data_local;
  int n_layer_local;
  TextureCubeMapArrayGenerateMipMapFilterable *this_local;
  
  for (n_component = 0; n_component < width; n_component = n_component + 1) {
    for (pixel_size = 0; (int)pixel_size < height; pixel_size = pixel_size + 1) {
      for (result_ptr._4_4_ = 0; result_ptr._4_4_ < 4; result_ptr._4_4_ = result_ptr._4_4_ + 1) {
        data[(pixel_size * width + n_component) * 4 + result_ptr._4_4_] =
             m_layer_face_data
             [(long)result_ptr._4_4_ +
              (ulong)(uint)((int)(n_component % 2 + pixel_size) % 2) * 4 + (long)n_layer * 8];
      }
    }
  }
  return;
}

Assistant:

void TextureCubeMapArrayGenerateMipMapFilterable::generateTestData(int n_layer, unsigned char* data, int width,
																   int height)
{
	DE_ASSERT(data != DE_NULL);

	for (int x = 0; x < width; ++x)
	{
		for (int y = 0; y < height; ++y)
		{
			for (int n_component = 0; n_component < m_n_components; ++n_component)
			{
				const unsigned int pixel_size = m_n_components;
				unsigned char*	 result_ptr = data + ((y * width + x) * pixel_size + n_component);
				unsigned int	   n_color	= ((x % m_n_colors_per_layer_face) + y) % m_n_colors_per_layer_face;

				*result_ptr = m_layer_face_data[n_layer][n_color][n_component];
			}
		}
	}
}